

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavApplyItemToResult(ImGuiNavItemData *result)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  ImRect IVar2;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  result->Window = window;
  result->ID = (pIVar1->LastItemData).ID;
  result->FocusScopeId = pIVar1->CurrentFocusScopeId;
  result->InFlags = (pIVar1->LastItemData).InFlags;
  IVar2 = WindowRectAbsToRel(window,&(pIVar1->LastItemData).NavRect);
  result->RectRel = IVar2;
  return;
}

Assistant:

static void ImGui::NavApplyItemToResult(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    result->Window = window;
    result->ID = g.LastItemData.ID;
    result->FocusScopeId = g.CurrentFocusScopeId;
    result->InFlags = g.LastItemData.InFlags;
    result->RectRel = WindowRectAbsToRel(window, g.LastItemData.NavRect);
}